

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

void iDynTree::addLinkToTraversal
               (Model *model,Traversal *traversal,LinkIndex linkToAdd,JointIndex parentJointToAdd,
               LinkIndex parentLinkToAdd,
               deque<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_> *linkToVisit)

{
  iterator *piVar1;
  pointer pLVar2;
  _Elt_pointer psVar3;
  stackEl el;
  stackEl local_30;
  
  pLVar2 = (model->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Traversal::addTraversalElement
            (traversal,pLVar2 + linkToAdd,
             (model->joints).
             super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
             super__Vector_impl_data._M_start[parentJointToAdd],pLVar2 + parentLinkToAdd);
  local_30.parent =
       (model->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_30.link = local_30.parent + linkToAdd;
  local_30.parent = local_30.parent + parentLinkToAdd;
  psVar3 = (linkToVisit->super__Deque_base<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar3 == (linkToVisit->
                super__Deque_base<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<iDynTree::stackEl,std::allocator<iDynTree::stackEl>>::
    _M_push_back_aux<iDynTree::stackEl_const&>
              ((deque<iDynTree::stackEl,std::allocator<iDynTree::stackEl>> *)linkToVisit,&local_30);
  }
  else {
    psVar3->link = local_30.link;
    psVar3->parent = local_30.parent;
    piVar1 = &(linkToVisit->super__Deque_base<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_>
              )._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void addLinkToTraversal(const Model & model, Traversal & traversal,
                        LinkIndex linkToAdd, JointIndex parentJointToAdd, LinkIndex parentLinkToAdd,
                        std::deque<stackEl> & linkToVisit)
{
    traversal.addTraversalElement(model.getLink(linkToAdd),
                                  model.getJoint(parentJointToAdd),
                                  model.getLink(parentLinkToAdd));

    stackEl el;
    el.link = model.getLink(linkToAdd);
    el.parent = model.getLink(parentLinkToAdd);

    linkToVisit.push_back(el);
}